

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O3

void conf_insert(Conf *conf,conf_entry *entry)

{
  conf_entry *pcVar1;
  
  pcVar1 = (conf_entry *)add234(conf->tree,entry);
  if (pcVar1 != entry && pcVar1 != (conf_entry *)0x0) {
    del234(conf->tree,pcVar1);
    free_entry(pcVar1);
    pcVar1 = (conf_entry *)add234(conf->tree,entry);
    if (pcVar1 != entry) {
      __assert_fail("oldentry == entry",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c"
                    ,0xec,"void conf_insert(Conf *, struct conf_entry *)");
    }
  }
  return;
}

Assistant:

static void conf_insert(Conf *conf, struct conf_entry *entry)
{
    struct conf_entry *oldentry = add234(conf->tree, entry);
    if (oldentry && oldentry != entry) {
        del234(conf->tree, oldentry);
        free_entry(oldentry);
        oldentry = add234(conf->tree, entry);
        assert(oldentry == entry);
    }
}